

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

void target_rebase(gen_ctx_t gen_ctx,uint8_t *base)

{
  MIR_context_t ctx;
  MIR_code_reloc_t obj;
  size_t sVar1;
  uint64_t uVar2;
  int64_t iVar3;
  MIR_code_reloc_t *relocs;
  ulong local_30;
  size_t i;
  MIR_code_reloc_t reloc;
  uint8_t *base_local;
  gen_ctx_t gen_ctx_local;
  
  VARR_MIR_code_reloc_ttrunc(gen_ctx->target_ctx->relocs,0);
  local_30 = 0;
  while( true ) {
    sVar1 = VARR_uint64_tlength(gen_ctx->target_ctx->abs_address_locs);
    if (sVar1 <= local_30) break;
    uVar2 = VARR_uint64_tget(gen_ctx->target_ctx->abs_address_locs,local_30);
    iVar3 = get_int64(base + uVar2,8);
    obj.value = base + iVar3;
    obj.offset = uVar2;
    VARR_MIR_code_reloc_tpush(gen_ctx->target_ctx->relocs,obj);
    local_30 = local_30 + 1;
  }
  ctx = gen_ctx->ctx;
  sVar1 = VARR_MIR_code_reloc_tlength(gen_ctx->target_ctx->relocs);
  relocs = VARR_MIR_code_reloc_taddr(gen_ctx->target_ctx->relocs);
  _MIR_update_code_arr(ctx,base,sVar1,relocs);
  change_calls(gen_ctx,base);
  gen_setup_lrefs(gen_ctx,base);
  return;
}

Assistant:

static void target_rebase (gen_ctx_t gen_ctx, uint8_t *base) {
  MIR_code_reloc_t reloc;

  VARR_TRUNC (MIR_code_reloc_t, relocs, 0);
  for (size_t i = 0; i < VARR_LENGTH (uint64_t, abs_address_locs); i++) {
    reloc.offset = VARR_GET (uint64_t, abs_address_locs, i);
    reloc.value = base + get_int64 (base + reloc.offset, 8);
    VARR_PUSH (MIR_code_reloc_t, relocs, reloc);
  }
  _MIR_update_code_arr (gen_ctx->ctx, base, VARR_LENGTH (MIR_code_reloc_t, relocs),
                        VARR_ADDR (MIR_code_reloc_t, relocs));
  change_calls (gen_ctx, base);
  gen_setup_lrefs (gen_ctx, base);
}